

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O1

void __thiscall
QMakeParser::finalizeCall(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int argc)

{
  ushort uVar1;
  char16_t *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  iterator iVar7;
  QChar QVar8;
  ushort uVar9;
  storage_type *psVar10;
  QMakeParser *pQVar11;
  ushort *puVar12;
  ushort *puVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QByteArrayView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QStringView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QAnyStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QArrayData *local_70 [3];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*uc == 9) {
    uVar15 = (ulong)uc[3];
    bVar4 = true;
    if (uc[uVar15 + 4] != 0x11) goto LAB_0028e6c1;
    puVar12 = uc + uVar15 + 5;
    QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + 4));
    pcVar2 = (this->m_tmp).d.ptr;
    lVar14 = (this->m_tmp).d.size;
    if ((lVar14 == (anonymous_namespace)::statics._40_8_) &&
       (QVar16.m_data = pcVar2, QVar16.m_size = lVar14,
       QVar37.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._32_8_,
       QVar37.m_size = (anonymous_namespace)::statics._40_8_,
       cVar3 = QtPrivate::equalStrings(QVar16,QVar37), cVar3 != '\0')) {
      if (this->m_operator == AndOperator) {
        this->m_operator = NoOperator;
      }
      bVar4 = failOperator(this,"in front of for()");
      if (bVar4) {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        local_58.d.size = 0;
LAB_0028dfbc:
        bogusTest(this,tokPtr,&local_58);
      }
      else {
        pQVar11 = this;
        flushCond(this,tokPtr);
        iVar5 = this->m_markLine;
        if (iVar5 != 0) {
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 1;
          *tokPtr = puVar13 + 2;
          puVar13[1] = (ushort)iVar5;
          this->m_markLine = 0;
        }
        ptr = ptr + -1;
        if (*puVar12 != 0x208) {
          puVar13 = uc;
          if (argc != 1) goto LAB_0028e450;
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 0x19;
          sVar6 = ProString::hash((QChar *)0x0,0);
          puVar13 = *tokPtr;
          *puVar13 = (ushort)sVar6;
          puVar13[1] = (ushort)(sVar6 >> 0x10);
          puVar13[2] = 0;
          *tokPtr = puVar13 + 3;
LAB_0028e406:
          uVar15 = (long)ptr - (long)puVar12;
          iVar5 = (int)(uVar15 >> 1) + 1;
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = (ushort)iVar5;
          *tokPtr = puVar13 + 2;
          puVar13[1] = (ushort)((uint)iVar5 >> 0x10);
          memcpy(puVar13 + 2,puVar12,uVar15 & 0xffffffff);
          *tokPtr = (ushort *)((long)*tokPtr + (uVar15 & 0x1fffffffe));
LAB_0028e687:
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 7;
          enterScope(this,tokPtr,true,StCtrl);
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          iVar7.i[-1].nest = iVar7.i[-1].nest | 1;
          uc = puVar12;
LAB_0028e6be:
          bVar4 = false;
          goto LAB_0028e6c1;
        }
        uVar1 = uc[uVar15 + 6];
        puVar12 = uc + uVar15 + (ulong)uVar1 + 7;
        if (puVar12 == ptr) {
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 0x19;
          pQVar11 = (QMakeParser *)0x0;
          sVar6 = ProString::hash((QChar *)0x0,0);
          puVar13 = *tokPtr;
          *puVar13 = (ushort)sVar6;
          puVar13[1] = (ushort)(sVar6 >> 0x10);
          puVar13[2] = 0;
          *tokPtr = puVar13 + 4;
          puVar13[3] = (ushort)(uVar1 + 5);
          *tokPtr = puVar13 + 5;
          puVar13[4] = (ushort)(uVar1 + 5 >> 0x10);
          *tokPtr = puVar13 + 6;
          puVar13[5] = 9;
          putHashStr(pQVar11,tokPtr,uc + uVar15 + 7,(uint)uVar1);
          goto LAB_0028e687;
        }
        puVar13 = puVar12;
        if ((argc == 2) && (*puVar12 == 0xe)) {
          puVar12 = uc + uVar15 + (ulong)uVar1 + 8;
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 0x19;
          putHashStr(pQVar11,tokPtr,uc + uVar15 + 7,(uint)uVar1);
          goto LAB_0028e406;
        }
LAB_0028e450:
        QVar28.m_data = (storage_type *)0x39;
        QVar28.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar28);
        uc = puVar13;
LAB_0028e46d:
        message(this,0x301,&local_58);
        this->m_proFile->m_ok = false;
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar4 = false;
    }
    else {
      if ((lVar14 == (anonymous_namespace)::statics._88_8_) &&
         (QVar17.m_data = pcVar2, QVar17.m_size = lVar14,
         QVar38.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._80_8_,
         QVar38.m_size = (anonymous_namespace)::statics._88_8_,
         cVar3 = QtPrivate::equalStrings(QVar17,QVar38), cVar3 != '\0')) {
        uVar9 = 0x1b;
        lVar14 = 0x2e2898;
LAB_0028df8c:
        if (this->m_invert != 0) {
          psVar10 = (storage_type *)0x38;
LAB_0028dfb4:
          QVar19.m_data = psVar10;
          QVar19.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar19);
          goto LAB_0028dfbc;
        }
        flushScopes(this,tokPtr);
        iVar5 = this->m_markLine;
        if (iVar5 != 0) {
          puVar13 = *tokPtr;
          *tokPtr = puVar13 + 1;
          *puVar13 = 1;
          *tokPtr = puVar13 + 2;
          puVar13[1] = (ushort)iVar5;
          this->m_markLine = 0;
        }
        if ((*puVar12 == 0x208) && (uVar1 = uc[uVar15 + 6], uc[uVar15 + (ulong)uVar1 + 7] == 0xf)) {
          pQVar11 = this;
          putOperator(this,tokPtr);
          puVar12 = *tokPtr;
          *tokPtr = puVar12 + 1;
          *puVar12 = uVar9;
          putHashStr(pQVar11,tokPtr,uc + uVar15 + 7,(uint)uVar1);
          enterScope(this,tokPtr,true,StCtrl);
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          iVar7.i[-1].nest = '\x02';
          goto LAB_0028e6be;
        }
        QVar26.m_data = (storage_type *)0x2b;
        QVar26.m_size = (qsizetype)local_70;
        QString::fromLatin1(QVar26);
        QVar27.m_size = (size_t)local_70;
        QVar27.field_0.m_data = &local_58;
        QString::arg_impl(QVar27,(int)*(undefined8 *)(lVar14 + 8),
                          (QChar)(char16_t)*(undefined8 *)(lVar14 + 0x10));
        message(this,0x301,&local_58);
        this->m_proFile->m_ok = false;
LAB_0028e586:
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_70[0] != (QArrayData *)0x0) {
          LOCK();
          (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_70[0],2,0x10);
          }
        }
      }
      else {
        if ((lVar14 == (anonymous_namespace)::statics._64_8_) &&
           (QVar18.m_data = pcVar2, QVar18.m_size = lVar14,
           QVar39.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._56_8_,
           QVar39.m_size = (anonymous_namespace)::statics._64_8_,
           cVar3 = QtPrivate::equalStrings(QVar18,QVar39), cVar3 != '\0')) {
          uVar9 = 0x1a;
          lVar14 = 0x2e2880;
          goto LAB_0028df8c;
        }
        if ((lVar14 == (anonymous_namespace)::statics._112_8_) &&
           (QVar20.m_data = pcVar2, QVar20.m_size = lVar14,
           QVar40.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._104_8_,
           QVar40.m_size = (anonymous_namespace)::statics._112_8_,
           cVar3 = QtPrivate::equalStrings(QVar20,QVar40), cVar3 != '\0')) {
          if (*puVar12 == 0xf) {
            iVar7 = QList<QMakeParser::BlockScope>::end
                              (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
            if ((iVar7.i[-1].nest & 2) == 0) {
              psVar10 = (storage_type *)0x10;
            }
            else {
              if (this->m_invert == 0) {
                flushScopes(this,tokPtr);
                iVar5 = this->m_markLine;
                if (iVar5 != 0) {
                  puVar12 = *tokPtr;
                  *tokPtr = puVar12 + 1;
                  *puVar12 = 1;
                  *tokPtr = puVar12 + 2;
                  puVar12[1] = (ushort)iVar5;
                  this->m_markLine = 0;
                }
                putOperator(this,tokPtr);
                puVar12 = *tokPtr;
                *tokPtr = puVar12 + 1;
                *puVar12 = 0x1c;
                enterScope(this,tokPtr,true,StCtrl);
                goto LAB_0028e6be;
              }
              psVar10 = (storage_type *)0x29;
            }
            QVar31.m_data = psVar10;
            QVar31.m_size = (qsizetype)local_70;
            QString::fromLatin1(QVar31);
            iVar5 = (int)(this->m_tmp).d.ptr;
            QVar8.ucs = (char16_t)(this->m_tmp).d.size;
          }
          else {
LAB_0028e31b:
            QVar25.m_data = (storage_type *)0x1d;
            QVar25.m_size = (qsizetype)local_70;
            QString::fromLatin1(QVar25);
            iVar5 = (int)(this->m_tmp).d.ptr;
            QVar8.ucs = (char16_t)(this->m_tmp).d.size;
          }
          QVar32.field_0.m_data = &local_58;
          QVar32.m_size = local_70;
          QString::arg_impl(QVar32,iVar5,QVar8);
LAB_0028e57e:
          bogusTest(this,tokPtr,&local_58);
          goto LAB_0028e586;
        }
        if ((lVar14 == (anonymous_namespace)::statics._160_8_) &&
           (QVar21.m_data = pcVar2, QVar21.m_size = lVar14,
           QVar41.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._152_8_,
           QVar41.m_size = (anonymous_namespace)::statics._160_8_,
           cVar3 = QtPrivate::equalStrings(QVar21,QVar41), cVar3 != '\0')) {
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((iVar7.i[-1].nest & 2) == 0) {
            uVar9 = 0x12;
            if (*puVar12 == 0xf) goto LAB_0028e4b5;
            psVar10 = (storage_type *)0x2b;
          }
          else {
            uVar9 = 0x12;
            if (argc < 2) {
LAB_0028e4b5:
              if (this->m_invert == 0) {
                finalizeTest(this,tokPtr);
                iVar5 = (int)((ulong)((long)ptr - (long)puVar12) >> 1);
                memcpy(*tokPtr,puVar12,(ulong)(iVar5 * 2 - 2));
                puVar12 = *tokPtr;
                *tokPtr = puVar12 + (iVar5 - 1) + 1;
                puVar12[iVar5 - 1] = uVar9;
                goto LAB_0028e6be;
              }
              psVar10 = (storage_type *)0x29;
              goto LAB_0028e4d1;
            }
            psVar10 = (storage_type *)0x27;
          }
          goto LAB_0028dfb4;
        }
        if (lVar14 == (anonymous_namespace)::statics._184_8_) {
          QVar22.m_data = pcVar2;
          QVar22.m_size = lVar14;
          QVar42.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._176_8_;
          QVar42.m_size = (anonymous_namespace)::statics._184_8_;
          cVar3 = QtPrivate::equalStrings(QVar22,QVar42);
          uVar9 = 0x14;
          if (cVar3 == '\0') goto LAB_0028e0e6;
LAB_0028e10c:
          if (*puVar12 != 0xf) goto LAB_0028e31b;
          iVar7 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((iVar7.i[-1].nest & 1) != 0) goto LAB_0028e4b5;
          psVar10 = (storage_type *)0x10;
LAB_0028e4d1:
          QVar29.m_data = psVar10;
          QVar29.m_size = (qsizetype)local_70;
          QString::fromLatin1(QVar29);
          QVar30.m_size = (size_t)local_70;
          QVar30.field_0.m_data = &local_58;
          QString::arg_impl(QVar30,(int)(this->m_tmp).d.ptr,(QChar)(char16_t)(this->m_tmp).d.size);
          goto LAB_0028e57e;
        }
LAB_0028e0e6:
        if (lVar14 == (anonymous_namespace)::statics._208_8_) {
          QVar23.m_data = pcVar2;
          QVar23.m_size = lVar14;
          QVar43.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._200_8_;
          QVar43.m_size = (anonymous_namespace)::statics._208_8_;
          cVar3 = QtPrivate::equalStrings(QVar23,QVar43);
          uVar9 = 0x13;
          if (cVar3 != '\0') goto LAB_0028e10c;
        }
        bVar4 = true;
        if ((lVar14 != (anonymous_namespace)::statics._136_8_) ||
           (QVar24.m_data = pcVar2, QVar24.m_size = lVar14,
           QVar44.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._128_8_,
           QVar44.m_size = (anonymous_namespace)::statics._136_8_,
           cVar3 = QtPrivate::equalStrings(QVar24,QVar44), cVar3 == '\0')) goto LAB_0028e6c1;
        if ((this->m_state != StNew) ||
           ((((iVar7 = QList<QMakeParser::BlockScope>::end
                                 (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>),
              iVar7.i[-1].braceLevel != 0 ||
              (1 < (ulong)(this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size)) ||
             (this->m_invert != 0)) || (this->m_operator != NoOperator)))) {
          psVar10 = (storage_type *)0x34;
          goto LAB_0028dfb4;
        }
        if ((*puVar12 != 0x208) || (uc[uVar15 + (ulong)uc[uVar15 + 6] + 7] != 0xf)) {
          QVar34.m_data = (storage_type *)0x27;
          QVar34.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar34);
          goto LAB_0028e46d;
        }
        QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + uVar15 + 7));
        lVar14 = (this->m_tmp).d.size;
        if ((lVar14 != (anonymous_namespace)::statics._232_8_) ||
           (QVar33.m_data = (this->m_tmp).d.ptr, QVar33.m_size = lVar14,
           QVar45.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._224_8_,
           QVar45.m_size = (anonymous_namespace)::statics._232_8_,
           cVar3 = QtPrivate::equalStrings(QVar33,QVar45), cVar3 == '\0')) {
          QVar35.m_data = (storage_type *)0x14;
          QVar35.m_size = (qsizetype)local_70;
          QString::fromLatin1(QVar35);
          QVar36.m_size = (size_t)local_70;
          QVar36.field_0.m_data = &local_58;
          QString::arg_impl(QVar36,(int)(this->m_tmp).d.ptr,(QChar)(char16_t)(this->m_tmp).d.size);
          message(this,0x301,&local_58);
          this->m_proFile->m_ok = false;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_70[0] != (QArrayData *)0x0) {
            LOCK();
            (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_70[0],2,0x10);
            }
          }
          bVar4 = false;
          goto LAB_0028e6c1;
        }
        this->m_proFile->m_hostBuild = true;
      }
      bVar4 = false;
    }
LAB_0028e6c1:
    if (!bVar4) goto LAB_0028e6f3;
  }
  finalizeTest(this,tokPtr);
  memcpy(*tokPtr,uc,(long)ptr - (long)uc & 0xffffffff);
  *tokPtr = (ushort *)((long)*tokPtr + ((long)ptr - (long)uc & 0x1fffffffeU));
LAB_0028e6f3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeParser::finalizeCall(ushort *&tokPtr, ushort *uc, ushort *ptr, int argc)
{
    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (*uce == TokTestCall) {
            uce++;
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            const QString *defName;
            ushort defType;
            if (m_tmp == statics.strfor) {
                if (!acceptColon("in front of for()")) {
                    bogusTest(tokPtr, QString());
                    return;
                }
                flushCond(tokPtr);
                putLineMarker(tokPtr);
                --ptr;
                Q_ASSERT(*ptr == TokFuncTerminator);
                if (*uce == (TokLiteral|TokNewStr)) {
                    nlen = uce[1];
                    uc = uce + 2 + nlen;
                    if (uc == ptr) {
                        // for(literal) (only "ever" would be legal if qmake was sane)
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, nullptr, (uint)0);
                        putBlockLen(tokPtr, 1 + 3 + nlen + 1);
                        putTok(tokPtr, TokHashLiteral);
                        putHashStr(tokPtr, uce + 2, nlen);
                      didFor:
                        putTok(tokPtr, TokValueTerminator);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest |= NestLoop;
                        return;
                    } else if (*uc == TokArgSeparator && argc == 2) {
                        // for(var, something)
                        uc++;
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, uce + 2, nlen);
                      doFor:
                        nlen = ptr - uc;
                        putBlockLen(tokPtr, nlen + 1);
                        putBlock(tokPtr, uc, nlen);
                        goto didFor;
                    }
                } else if (argc == 1) {
                    // for(non-literal) (this wouldn't be here if qmake was sane)
                    putTok(tokPtr, TokForLoop);
                    putHashStr(tokPtr, nullptr, (uint)0);
                    uc = uce;
                    goto doFor;
                }
                parseError(fL1S("Syntax is for(var, list), for(var, forever) or for(ever)."));
                return;
            } else if (m_tmp == statics.strdefineReplace) {
                defName = &statics.strdefineReplace;
                defType = TokReplaceDef;
                goto deffunc;
            } else if (m_tmp == statics.strdefineTest) {
                defName = &statics.strdefineTest;
                defType = TokTestDef;
              deffunc:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of function definition."));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        putOperator(tokPtr);
                        putTok(tokPtr, defType);
                        putHashStr(tokPtr, uce + 2, nlen);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest = NestFunction;
                        return;
                    }
                }
                parseError(fL1S("%1(function) requires one literal argument.").arg(*defName));
                return;
            } else if (m_tmp == statics.strbypassNesting) {
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestFunction)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                putOperator(tokPtr);
                putTok(tokPtr, TokBypassNesting);
                enterScope(tokPtr, true, StCtrl);
                return;
            } else if (m_tmp == statics.strreturn) {
                if (m_blockstack.top().nest & NestFunction) {
                    if (argc > 1) {
                        bogusTest(tokPtr, fL1S("return() requires zero or one argument."));
                        return;
                    }
                } else {
                    if (*uce != TokFuncTerminator) {
                        bogusTest(tokPtr, fL1S("Top-level return() requires zero arguments."));
                        return;
                    }
                }
                defType = TokReturn;
                goto ctrlstm2;
            } else if (m_tmp == statics.strnext) {
                defType = TokNext;
                goto ctrlstm;
            } else if (m_tmp == statics.strbreak) {
                defType = TokBreak;
              ctrlstm:
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestLoop)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
              ctrlstm2:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                finalizeTest(tokPtr);
                putBlock(tokPtr, uce, ptr - uce - 1); // Only for TokReturn
                putTok(tokPtr, defType);
                return;
            } else if (m_tmp == statics.stroption) {
                if (m_state != StNew || m_blockstack.top().braceLevel || m_blockstack.size() > 1
                        || m_invert || m_operator != NoOperator) {
                    bogusTest(tokPtr, fL1S("option() must appear outside any control structures."));
                    return;
                }
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        m_tmp.setRawData((QChar *)uce + 2, nlen);
                        if (m_tmp == statics.strhost_build)
                            m_proFile->setHostBuild(true);
                        else
                            parseError(fL1S("Unknown option() %1.").arg(m_tmp));
                        return;
                    }
                }
                parseError(fL1S("option() requires one literal argument."));
                return;
            }
        }
    }

    finalizeTest(tokPtr);
    putBlock(tokPtr, uc, ptr - uc);
}